

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::WeightParams::Clear(WeightParams *this)

{
  string *psVar1;
  Arena *pAVar2;
  WeightParams *this_local;
  
  google::protobuf::RepeatedField<float>::Clear(&this->floatvalue_);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->float16value_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->rawvalue_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->int8rawvalue_,psVar1);
  pAVar2 = GetArenaNoVirtual(this);
  if (((pAVar2 == (Arena *)0x0) && (this->quantization_ != (QuantizationParams *)0x0)) &&
     (this->quantization_ != (QuantizationParams *)0x0)) {
    (*(this->quantization_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->quantization_ = (QuantizationParams *)0x0;
  this->isupdatable_ = false;
  return;
}

Assistant:

void WeightParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.WeightParams)
  floatvalue_.Clear();
  float16value_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  rawvalue_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  int8rawvalue_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (GetArenaNoVirtual() == NULL && quantization_ != NULL) {
    delete quantization_;
  }
  quantization_ = NULL;
  isupdatable_ = false;
}